

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_ST_zprr(DisasContext_conflict1 *s,arg_rprr_store *a)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  uintptr_t o_1;
  TCGv_i64 ret;
  TCGv_i64 pTVar2;
  _Bool _Var3;
  uintptr_t o;
  
  if ((a->rm == 0x1f) || (a->esz < a->msz)) {
    _Var3 = false;
  }
  else {
    tcg_ctx = s->uc->tcg_ctx;
    _Var1 = sve_access_check_aarch64(s);
    _Var3 = true;
    if (_Var1) {
      ret = new_tmp_a64_aarch64(s);
      pTVar2 = cpu_reg_aarch64(s,a->rm);
      tcg_gen_shli_i64_aarch64(tcg_ctx,ret,pTVar2,(long)a->msz);
      pTVar2 = cpu_reg_sp_aarch64(s,a->rn);
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_add_i64,(TCGArg)(ret + (long)tcg_ctx),
                          (TCGArg)(ret + (long)tcg_ctx),(TCGArg)(pTVar2 + (long)tcg_ctx));
      do_st_zpa(s,a->rd,a->pg,ret,a->msz,a->esz,a->nreg);
    }
  }
  return _Var3;
}

Assistant:

static bool trans_ST_zprr(DisasContext *s, arg_rprr_store *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->rm == 31 || a->msz > a->esz) {
        return false;
    }
    if (sve_access_check(s)) {
        TCGv_i64 addr = new_tmp_a64(s);
        tcg_gen_shli_i64(tcg_ctx, addr, cpu_reg(s, a->rm), a->msz);
        tcg_gen_add_i64(tcg_ctx, addr, addr, cpu_reg_sp(s, a->rn));
        do_st_zpa(s, a->rd, a->pg, addr, a->msz, a->esz, a->nreg);
    }
    return true;
}